

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O2

void __thiscall amrex::FluxRegister::ClearInternalBorders(FluxRegister *this,Geometry *geom)

{
  FabSet *fs;
  undefined8 *puVar1;
  NumComps ncomp;
  uint uVar2;
  undefined8 uVar3;
  FabSet *pFVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int ii_1;
  long lVar8;
  long lVar9;
  int ii;
  long lVar10;
  Box result;
  double local_138;
  _Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_130;
  BoxArray *local_118;
  BoxArray *local_110;
  Box result_1;
  _Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_e8;
  Box local_cc;
  FabSet *local_b0;
  FabSetIter fsi;
  Vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_> tags;
  
  ncomp.n = this->ncomp;
  tags.super_vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>.
  super__Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tags.super_vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>.
  super__Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tags.super_vector<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>.
  super__Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = (this->super_BndryRegister).bndry;
  for (lVar9 = 0; pFVar4 = local_b0, lVar9 != 3; lVar9 = lVar9 + 1) {
    fs = local_b0 + lVar9;
    FabSetIter::FabSetIter(&fsi,fs);
    local_118 = &pFVar4[lVar9].m_mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray;
    local_110 = &pFVar4[lVar9 + 3].m_mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray
    ;
    while (fsi.super_MFIter.currentIndex < fsi.super_MFIter.endIndex) {
      MFIter::validbox(&local_cc,&fsi.super_MFIter);
      BoxArray::intersections
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )&local_130,local_110,&local_cc);
      lVar8 = 4;
      for (lVar10 = 0;
          lVar10 < (int)((ulong)((long)local_130._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_130._M_impl.super__Vector_impl_data._M_start) >> 5);
          lVar10 = lVar10 + 1) {
        piVar5 = &fsi.super_MFIter.currentIndex;
        if (fsi.super_MFIter.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar5 = ((fsi.super_MFIter.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + fsi.super_MFIter.currentIndex;
        }
        result.smallend.vect[0] = 0;
        result.smallend.vect[1] = 0;
        BaseFab<double>::setVal<(amrex::RunOn)1>
                  (&(fs->m_mf).super_FabArray<amrex::FArrayBox>.m_fabs_v.
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[*piVar5]->super_BaseFab<double>,
                   (double *)&result,
                   (Box *)((long)((local_130._M_impl.super__Vector_impl_data._M_start)->second).
                                 smallend.vect + lVar8 + -4),(DestComp)0x0,ncomp);
        lVar8 = lVar8 + 0x20;
      }
      if ((*(char *)((long)(geom->super_CoordSys).inv_dx + lVar9 + 0x19) != '\0') &&
         (iVar7 = local_cc.smallend.vect[lVar9], iVar7 == (geom->domain).smallend.vect[lVar9])) {
        iVar7 = ((geom->domain).bigend.vect[lVar9] - iVar7) + 1;
        result.bigend.vect[2] = local_cc.bigend.vect[2];
        result.btype.itype = local_cc.btype.itype;
        result.smallend.vect[0] = local_cc.smallend.vect[0];
        result.smallend.vect[1] = local_cc.smallend.vect[1];
        piVar5 = result.smallend.vect + lVar9;
        *piVar5 = *piVar5 + iVar7;
        piVar5 = result.bigend.vect + lVar9;
        *piVar5 = *piVar5 + iVar7;
        BoxArray::intersections
                  ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    *)&local_e8,local_110,&result);
        lVar8 = 4;
        for (lVar10 = 0;
            lVar10 < (int)((ulong)((long)local_e8._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_e8._M_impl.super__Vector_impl_data._M_start) >> 5);
            lVar10 = lVar10 + 1) {
          iVar7 = ~(geom->domain).bigend.vect[lVar9] + (geom->domain).smallend.vect[lVar9];
          piVar5 = (int *)((long)((local_e8._M_impl.super__Vector_impl_data._M_start)->second).
                                 smallend.vect + lVar8 + -4);
          uVar3 = *(undefined8 *)(piVar5 + 2);
          puVar1 = (undefined8 *)
                   ((long)((local_e8._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                          vect + lVar8 + 8);
          result_1.bigend.vect[1] = (int)((ulong)*puVar1 >> 0x20);
          result_1._20_8_ = puVar1[1];
          result_1.smallend.vect._0_8_ = *(undefined8 *)piVar5;
          result_1.smallend.vect[2] = (int)uVar3;
          result_1.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
          piVar5 = result_1.smallend.vect + lVar9;
          *piVar5 = *piVar5 + iVar7;
          piVar5 = result_1.bigend.vect + lVar9;
          *piVar5 = *piVar5 + iVar7;
          piVar5 = &fsi.super_MFIter.currentIndex;
          if (fsi.super_MFIter.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar5 = ((fsi.super_MFIter.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + fsi.super_MFIter.currentIndex;
          }
          local_138 = 0.0;
          BaseFab<double>::setVal<(amrex::RunOn)1>
                    (&(fs->m_mf).super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar5]->super_BaseFab<double>,
                     &local_138,&result_1,(DestComp)0x0,ncomp);
          lVar8 = lVar8 + 0x20;
        }
        std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ::~_Vector_base(&local_e8);
      }
      std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
      ~_Vector_base(&local_130);
      MFIter::operator++(&fsi.super_MFIter);
    }
    MFIter::~MFIter(&fsi.super_MFIter);
    FabSetIter::FabSetIter((FabSetIter *)&fsi.super_MFIter,pFVar4 + lVar9 + 3);
    piVar5 = &fsi.super_MFIter.currentIndex;
    while (fsi.super_MFIter.currentIndex < fsi.super_MFIter.endIndex) {
      MFIter::validbox(&local_cc,&fsi.super_MFIter);
      BoxArray::intersections
                ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> *
                 )&local_130,local_118,&local_cc);
      lVar8 = 4;
      for (lVar10 = 0;
          lVar10 < (int)((ulong)((long)local_130._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_130._M_impl.super__Vector_impl_data._M_start) >> 5);
          lVar10 = lVar10 + 1) {
        piVar6 = piVar5;
        if (fsi.super_MFIter.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar6 = ((fsi.super_MFIter.local_index_map)->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start + fsi.super_MFIter.currentIndex;
        }
        result.smallend.vect[0] = 0;
        result.smallend.vect[1] = 0;
        BaseFab<double>::setVal<(amrex::RunOn)1>
                  (&pFVar4[lVar9 + 3].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[*piVar6]->super_BaseFab<double>,
                   (double *)&result,
                   (Box *)((long)((local_130._M_impl.super__Vector_impl_data._M_start)->second).
                                 smallend.vect + lVar8 + -4),(DestComp)0x0,ncomp);
        lVar8 = lVar8 + 0x20;
      }
      if ((*(char *)((long)(geom->super_CoordSys).inv_dx + lVar9 + 0x19) != '\0') &&
         (uVar2 = local_cc.bigend.vect[lVar9], uVar2 == (geom->domain).bigend.vect[lVar9])) {
        iVar7 = ~uVar2 + (geom->domain).smallend.vect[lVar9];
        result.bigend.vect[2] = local_cc.bigend.vect[2];
        result.btype.itype = local_cc.btype.itype;
        result.smallend.vect[0] = local_cc.smallend.vect[0];
        result.smallend.vect[1] = local_cc.smallend.vect[1];
        piVar6 = result.smallend.vect + lVar9;
        *piVar6 = *piVar6 + iVar7;
        piVar6 = result.bigend.vect + lVar9;
        *piVar6 = *piVar6 + iVar7;
        BoxArray::intersections
                  ((vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    *)&local_e8,local_118,&result);
        lVar8 = 4;
        for (lVar10 = 0;
            lVar10 < (int)((ulong)((long)local_e8._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_e8._M_impl.super__Vector_impl_data._M_start) >> 5);
            lVar10 = lVar10 + 1) {
          iVar7 = ((geom->domain).bigend.vect[lVar9] - (geom->domain).smallend.vect[lVar9]) + 1;
          piVar6 = (int *)((long)((local_e8._M_impl.super__Vector_impl_data._M_start)->second).
                                 smallend.vect + lVar8 + -4);
          uVar3 = *(undefined8 *)(piVar6 + 2);
          puVar1 = (undefined8 *)
                   ((long)((local_e8._M_impl.super__Vector_impl_data._M_start)->second).smallend.
                          vect + lVar8 + 8);
          result_1.bigend.vect[1] = (int)((ulong)*puVar1 >> 0x20);
          result_1._20_8_ = puVar1[1];
          result_1.smallend.vect._0_8_ = *(undefined8 *)piVar6;
          result_1.smallend.vect[2] = (int)uVar3;
          result_1.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
          piVar6 = result_1.smallend.vect + lVar9;
          *piVar6 = *piVar6 + iVar7;
          piVar6 = result_1.bigend.vect + lVar9;
          *piVar6 = *piVar6 + iVar7;
          piVar6 = piVar5;
          if (fsi.super_MFIter.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar6 = ((fsi.super_MFIter.local_index_map)->super_vector<int,_std::allocator<int>_>).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start + fsi.super_MFIter.currentIndex;
          }
          local_138 = 0.0;
          BaseFab<double>::setVal<(amrex::RunOn)1>
                    (&pFVar4[lVar9 + 3].m_mf.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[*piVar6]->super_BaseFab<double>,
                     &local_138,&result_1,(DestComp)0x0,ncomp);
          lVar8 = lVar8 + 0x20;
        }
        std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
        ::~_Vector_base(&local_e8);
      }
      std::_Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>::
      ~_Vector_base(&local_130);
      MFIter::operator++(&fsi.super_MFIter);
    }
    MFIter::~MFIter(&fsi.super_MFIter);
  }
  std::_Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>::
  ~_Vector_base((_Vector_base<amrex::Array4BoxTag<double>,_std::allocator<amrex::Array4BoxTag<double>_>_>
                 *)&tags);
  return;
}

Assistant:

void
FluxRegister::ClearInternalBorders (const Geometry& geom)
{
    int nc = this->nComp();
    const Box& domain = geom.Domain();

    Vector<Array4BoxTag<Real> > tags;

    for (int dir = 0; dir < AMREX_SPACEDIM; dir++) {
        Orientation lo(dir, Orientation::low);
        Orientation hi(dir, Orientation::high);

        FabSet& frlo = (*this)[lo];
        FabSet& frhi = (*this)[hi];

        const BoxArray& balo = frlo.boxArray();
        const BoxArray& bahi = frhi.boxArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        {
            for (FabSetIter fsi(frlo); fsi.isValid(); ++fsi) {
                const Box& bx = fsi.validbox();
                const std::vector< std::pair<int,Box> >& isects = bahi.intersections(bx);
                auto const& frarr = frlo[fsi].array();
                for (int ii = 0; ii < static_cast<int>(isects.size()); ++ii) {
                    if (Gpu::inLaunchRegion()) {
                        tags.emplace_back(Array4BoxTag<Real>{frarr, isects[ii].second});
                    } else {
                        frlo[fsi].setVal<RunOn::Host>(0.0, isects[ii].second, 0, nc);
                    }
                }
                if (geom.isPeriodic(dir)) {
                    if (bx.smallEnd(dir) == domain.smallEnd(dir)) {
                        const Box& sbx = amrex::shift(bx, dir, domain.length(dir));
                        const std::vector<std::pair<int,Box> >& isects2 = bahi.intersections(sbx);
                        for (int ii = 0; ii < static_cast<int>(isects2.size()); ++ii) {
                            const Box& bx2 = amrex::shift(isects2[ii].second, dir, -domain.length(dir));
                            if (Gpu::inLaunchRegion()) {
                                tags.emplace_back(Array4BoxTag<Real>{frarr, bx2});
                            } else {
                                frlo[fsi].setVal<RunOn::Host>(0.0, bx2, 0, nc);
                            }
                        }
                    }
                }
            }

            for (FabSetIter fsi(frhi); fsi.isValid(); ++fsi) {
                const Box& bx = fsi.validbox();
                const std::vector< std::pair<int,Box> >& isects = balo.intersections(bx);
                auto const& frarr = frhi[fsi].array();
                for (int ii = 0; ii < static_cast<int>(isects.size()); ++ii) {
                    if (Gpu::inLaunchRegion()) {
                        tags.emplace_back(Array4BoxTag<Real>{frarr, isects[ii].second});
                    } else {
                        frhi[fsi].setVal<RunOn::Host>(0.0, isects[ii].second, 0, nc);
                    }
                }
                if (geom.isPeriodic(dir)) {
                    if (bx.bigEnd(dir) == domain.bigEnd(dir)) {
                        const Box& sbx = amrex::shift(bx, dir, -domain.length(dir));
                        const std::vector<std::pair<int,Box> >& isects2 = balo.intersections(sbx);
                        for (int ii = 0; ii < static_cast<int>(isects2.size()); ++ii) {
                            const Box& bx2 = amrex::shift(isects2[ii].second, dir, domain.length(dir));
                            if (Gpu::inLaunchRegion()) {
                                tags.emplace_back(Array4BoxTag<Real>{frarr, bx2});
                            } else {
                                frhi[fsi].setVal<RunOn::Host>(0.0, bx2, 0, nc);
                            }
                        }
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    // There is Gpu::streamSynchronize in Parallelfor below internally.
    ParallelFor(tags, nc,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag)
    {
        tag.dfab(i,j,k,n) = 0.0;
    });
#endif
}